

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_send(ptls_t *tls,ptls_buffer_t *sendbuf,void *_input,size_t inlen)

{
  uint8_t *puVar1;
  byte bVar2;
  uint8_t *puVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t inlen_00;
  size_t sVar9;
  size_t enc_size;
  size_t local_38;
  
  if (tls->state != PTLS_STATE_CLIENT_SEND_EARLY_DATA &&
      tls->state < PTLS_STATE_SERVER_EXPECT_FINISHED) {
    __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_FINISHED || tls->state == PTLS_STATE_CLIENT_SEND_EARLY_DATA"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x944,"int ptls_send(ptls_t *, ptls_buffer_t *, const void *, size_t)");
  }
  bVar2 = *(byte *)&(tls->field_7).server;
  if ((bVar2 & 1) != 0) {
    *(byte *)&(tls->field_7).server = bVar2 & 0xfe;
    iVar5 = send_session_ticket(tls,sendbuf);
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  if (inlen == 0) {
    iVar5 = 0;
  }
  else {
    do {
      inlen_00 = 0x4000;
      if (inlen < 0x4000) {
        inlen_00 = inlen;
      }
      iVar5 = ptls_buffer_reserve(sendbuf,3);
      if (iVar5 == 0) {
        puVar3 = sendbuf->base;
        sVar9 = sendbuf->off;
        puVar1 = puVar3 + sVar9;
        puVar1[0] = '\x17';
        puVar1[1] = '\x03';
        puVar3[sVar9 + 2] = '\x01';
        sendbuf->off = sendbuf->off + 3;
        iVar5 = 0;
      }
      if (iVar5 != 0) {
        return iVar5;
      }
      iVar5 = ptls_buffer_reserve(sendbuf,2);
      if (iVar5 == 0) {
        puVar1 = sendbuf->base;
        sVar9 = sendbuf->off;
        (puVar1 + sVar9)[0] = '\0';
        (puVar1 + sVar9)[1] = '\0';
        sendbuf->off = sendbuf->off + 2;
        iVar5 = 0;
      }
      bVar4 = true;
      if (iVar5 == 0) {
        sVar9 = sendbuf->off;
        iVar5 = ptls_buffer_reserve(sendbuf,inlen_00 + 0x100);
        if ((iVar5 == 0) &&
           (iVar5 = ptls_aead_transform((tls->traffic_protection).enc.aead,
                                        sendbuf->base + sendbuf->off,&local_38,_input,inlen_00,
                                        '\x17'), iVar5 == 0)) {
          sVar6 = sendbuf->off + local_38;
          sendbuf->off = sVar6;
          uVar7 = sVar6 - sVar9;
          lVar8 = 8;
          do {
            sendbuf->base[sVar9 - 2] = (uint8_t)(uVar7 >> ((byte)lVar8 & 0x3f));
            lVar8 = lVar8 + -8;
            sVar9 = sVar9 + 1;
          } while (lVar8 != -8);
          iVar5 = 0;
          bVar4 = false;
        }
      }
      if (bVar4) {
        return iVar5;
      }
      _input = (void *)((long)_input + inlen_00);
      inlen = inlen - inlen_00;
    } while (inlen != 0);
  }
  return iVar5;
}

Assistant:

int ptls_send(ptls_t *tls, ptls_buffer_t *sendbuf, const void *_input, size_t inlen)
{
    const uint8_t *input = (const uint8_t *)_input;
    size_t pt_size, enc_size;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_FINISHED || tls->state == PTLS_STATE_CLIENT_SEND_EARLY_DATA);

    if (tls->server.send_ticket) {
        tls->server.send_ticket = 0;
        if ((ret = send_session_ticket(tls, sendbuf)) != 0)
            goto Exit;
    }

    for (; inlen != 0; input += pt_size, inlen -= pt_size) {
        pt_size = inlen;
        if (pt_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            pt_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_APPDATA, {
            if ((ret = ptls_buffer_reserve(sendbuf, pt_size + 256)) != 0)
                goto Exit;
            if ((ret = ptls_aead_transform(tls->traffic_protection.enc.aead, sendbuf->base + sendbuf->off, &enc_size, input,
                                           pt_size, PTLS_CONTENT_TYPE_APPDATA)) != 0)
                goto Exit;
            sendbuf->off += enc_size;
        });
    }

Exit:
    return ret;
}